

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDIOAnalyzer.cpp
# Opt level: O1

void __thiscall SDIOAnalyzer::SetupResults(SDIOAnalyzer *this)

{
  SDIOAnalyzerResults *pSVar1;
  SDIOAnalyzerResults *this_00;
  
  this_00 = (SDIOAnalyzerResults *)operator_new(0x20);
  SDIOAnalyzerResults::SDIOAnalyzerResults
            (this_00,this,
             (this->mSettings)._M_t.
             super___uniq_ptr_impl<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>
             ._M_t.
             super__Tuple_impl<0UL,_SDIOAnalyzerSettings_*,_std::default_delete<SDIOAnalyzerSettings>_>
             .super__Head_base<0UL,_SDIOAnalyzerSettings_*,_false>._M_head_impl);
  pSVar1 = (this->mResults)._M_t.
           super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>.
           _M_t.
           super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>.
           super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl;
  (this->mResults)._M_t.
  super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>._M_t.
  super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>.
  super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl = this_00;
  if (pSVar1 != (SDIOAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pSVar1 + 8))();
  }
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn
            ((Channel *)
             (this->mResults)._M_t.
             super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>.
             _M_t.
             super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>
             .super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl);
  return;
}

Assistant:

void SDIOAnalyzer::SetupResults()
{
    mResults.reset( new SDIOAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );

    // mResults->AddChannelBubblesWillAppearOn(mSettings->mClockChannel);
    mResults->AddChannelBubblesWillAppearOn( mSettings->mCmdChannel );
    // mResults->AddChannelBubblesWillAppearOn(mSettings->mDAT0Channel);
    // mResults->AddChannelBubblesWillAppearOn(mSettings->mDAT1Channel);
    // mResults->AddChannelBubblesWillAppearOn(mSettings->mDAT2Channel);
    // mResults->AddChannelBubblesWillAppearOn(mSettings->mDAT3Channel);
}